

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O1

void lj_trace_ins(jit_State *J,BCIns *pc)

{
  int iVar1;
  GCfunc *pGVar2;
  GCproto *pGVar3;
  
  J->pc = pc;
  pGVar2 = (GCfunc *)(J->L->base[-2].u64 & 0x7fffffffffff);
  J->fn = pGVar2;
  if ((pGVar2->c).ffid == '\0') {
    pGVar3 = (GCproto *)((pGVar2->c).pc.ptr64 - 0x68);
  }
  else {
    pGVar3 = (GCproto *)0x0;
  }
  J->pt = pGVar3;
  iVar1 = lj_vm_cpcall(J->L,0,J,trace_state);
  while (iVar1 != 0) {
    J->state = LJ_TRACE_ERR;
    iVar1 = lj_vm_cpcall(J->L,0,J,trace_state);
  }
  return;
}

Assistant:

void lj_trace_ins(jit_State *J, const BCIns *pc)
{
  /* Note: J->L must already be set. pc is the true bytecode PC here. */
  J->pc = pc;
  J->fn = curr_func(J->L);
  J->pt = isluafunc(J->fn) ? funcproto(J->fn) : NULL;
  while (lj_vm_cpcall(J->L, NULL, (void *)J, trace_state) != 0)
    J->state = LJ_TRACE_ERR;
}